

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  pa_shard_stats_t *ppVar1;
  pac_stats_t *ppVar2;
  locked_u64_t *plVar3;
  pac_decay_stats_t *ppVar4;
  uint64_t *puVar5;
  long *plVar6;
  size_t *psVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  ctl_arena_stats_t *pcVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ctl_arena_t *pcVar17;
  size_t sVar18;
  uint64_t uVar19;
  long lVar20;
  ctl_arena_stats_t *pcVar21;
  size_t *psVar22;
  nstime_t *pnVar23;
  nstime_t *pnVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  
  pcVar17 = arenas_i((ulong)i);
  pcVar17->nthreads = 0;
  pcVar17->dss = "N/A";
  *(undefined4 *)&pcVar17->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar17->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&pcVar17->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar17->muzzy_decay_ms + 4) = 0xffffffff;
  pcVar17->pactive = 0;
  pcVar17->pdirty = 0;
  pcVar17->pmuzzy = 0;
  switchD_005681f0::default(pcVar17->astats,0,0x9818);
  pcVar11 = pcVar17->astats;
  duckdb_je_arena_stats_merge
            (tsdn,arena,&pcVar17->nthreads,&pcVar17->dss,&pcVar17->dirty_decay_ms,
             &pcVar17->muzzy_decay_ms,&pcVar17->pactive,&pcVar17->pdirty,&pcVar17->pmuzzy,
             &pcVar11->astats,pcVar11->bstats,pcVar11->lstats,pcVar11->estats,&pcVar11->hpastats,
             &pcVar11->secstats);
  pcVar11 = pcVar17->astats;
  sVar18 = pcVar11->allocated_small;
  uVar25 = pcVar11->nmalloc_small;
  uVar26 = pcVar11->ndalloc_small;
  uVar19 = pcVar11->nrequests_small;
  uVar27 = pcVar11->nfills_small;
  uVar28 = pcVar11->nflushes_small;
  lVar20 = 0x51c;
  psVar22 = duckdb_je_sz_index2size_tab;
  do {
    sVar18 = sVar18 + *psVar22 * *(long *)((long)pcVar11 + lVar20 * 8 + -8);
    pcVar11->allocated_small = sVar18;
    plVar6 = (long *)((long)pcVar11 + lVar20 * 8 + -0x20);
    uVar25 = uVar25 + *plVar6;
    uVar26 = uVar26 + plVar6[1];
    pcVar11->nmalloc_small = uVar25;
    pcVar11->ndalloc_small = uVar26;
    uVar19 = uVar19 + *(long *)((long)pcVar11 + lVar20 * 8 + -0x10);
    pcVar11->nrequests_small = uVar19;
    psVar7 = &(pcVar11->astats).base + lVar20;
    uVar27 = uVar27 + *psVar7;
    uVar28 = uVar28 + psVar7[1];
    pcVar11->nfills_small = uVar27;
    pcVar11->nflushes_small = uVar28;
    lVar20 = lVar20 + 0x16;
    psVar22 = psVar22 + 1;
  } while (lVar20 != 0x834);
  if (destroyed) {
    pcVar21 = ctl_sdarena->astats;
  }
  else {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + pcVar17->nthreads;
    sVar18 = pcVar17->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + pcVar17->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar18;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + pcVar17->pmuzzy;
    pcVar21 = ctl_sdarena->astats;
    psVar22 = &(pcVar21->astats).mapped;
    *psVar22 = *psVar22 + (pcVar11->astats).mapped;
    psVar22 = &(pcVar21->astats).pa_shard_stats.pac_stats.retained;
    *psVar22 = *psVar22 + (pcVar11->astats).pa_shard_stats.pac_stats.retained;
    ppVar1 = &(pcVar21->astats).pa_shard_stats;
    ppVar1->edata_avail = ppVar1->edata_avail + (pcVar11->astats).pa_shard_stats.edata_avail;
  }
  ppVar2 = &(pcVar21->astats).pa_shard_stats.pac_stats;
  (ppVar2->decay_dirty).npurge.val.repr =
       (ppVar2->decay_dirty).npurge.val.repr +
       (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr;
  plVar3 = &(pcVar21->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise.val.repr
  ;
  plVar3 = &(pcVar21->astats).pa_shard_stats.pac_stats.decay_dirty.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.purged.val.repr;
  ppVar4 = &(pcVar21->astats).pa_shard_stats.pac_stats.decay_muzzy;
  (ppVar4->npurge).val.repr =
       (ppVar4->npurge).val.repr +
       (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.npurge.val.repr;
  plVar3 = &(pcVar21->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise.val.repr
  ;
  plVar3 = &(pcVar21->astats).pa_shard_stats.pac_stats.decay_muzzy.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.purged.val.repr;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[0].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[0].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[0].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[0].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[0].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[0].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[0].n_wait_times =
       (pcVar21->astats).mutex_prof_data[0].n_wait_times +
       (pcVar11->astats).mutex_prof_data[0].n_wait_times;
  (pcVar21->astats).mutex_prof_data[0].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[0].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[0].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[0].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[0].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[0].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[0].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[0].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[0].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[1].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[1].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[1].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[1].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[1].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[1].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[1].n_wait_times =
       (pcVar21->astats).mutex_prof_data[1].n_wait_times +
       (pcVar11->astats).mutex_prof_data[1].n_wait_times;
  (pcVar21->astats).mutex_prof_data[1].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[1].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[1].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[1].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[1].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[1].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[1].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[1].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[1].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[1].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[1].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[2].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[2].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[2].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[2].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[2].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[2].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[2].n_wait_times =
       (pcVar21->astats).mutex_prof_data[2].n_wait_times +
       (pcVar11->astats).mutex_prof_data[2].n_wait_times;
  (pcVar21->astats).mutex_prof_data[2].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[2].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[2].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[2].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[2].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[2].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[2].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[2].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[2].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[2].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[2].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[3].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[3].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[3].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[3].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[3].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[3].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[3].n_wait_times =
       (pcVar21->astats).mutex_prof_data[3].n_wait_times +
       (pcVar11->astats).mutex_prof_data[3].n_wait_times;
  (pcVar21->astats).mutex_prof_data[3].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[3].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[3].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[3].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[3].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[3].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[3].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[3].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[3].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[3].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[3].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[4].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[4].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[4].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[4].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[4].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[4].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[4].n_wait_times =
       (pcVar21->astats).mutex_prof_data[4].n_wait_times +
       (pcVar11->astats).mutex_prof_data[4].n_wait_times;
  (pcVar21->astats).mutex_prof_data[4].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[4].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[4].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[4].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[4].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[4].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[4].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[4].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[4].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[4].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[4].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[5].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[5].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[5].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[5].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[5].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[5].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[5].n_wait_times =
       (pcVar21->astats).mutex_prof_data[5].n_wait_times +
       (pcVar11->astats).mutex_prof_data[5].n_wait_times;
  (pcVar21->astats).mutex_prof_data[5].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[5].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[5].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[5].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[5].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[5].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[5].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[5].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[5].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[5].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[5].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[6].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[6].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[6].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[6].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[6].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[6].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[6].n_wait_times =
       (pcVar21->astats).mutex_prof_data[6].n_wait_times +
       (pcVar11->astats).mutex_prof_data[6].n_wait_times;
  (pcVar21->astats).mutex_prof_data[6].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[6].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[6].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[6].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[6].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[6].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[6].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[6].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[6].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[6].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[6].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[7].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[7].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[7].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[7].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[7].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[7].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[7].n_wait_times =
       (pcVar21->astats).mutex_prof_data[7].n_wait_times +
       (pcVar11->astats).mutex_prof_data[7].n_wait_times;
  (pcVar21->astats).mutex_prof_data[7].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[7].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[7].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[7].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[7].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[7].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[7].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[7].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[7].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[7].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[7].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[8].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[8].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[8].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[8].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[8].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[8].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[8].n_wait_times =
       (pcVar21->astats).mutex_prof_data[8].n_wait_times +
       (pcVar11->astats).mutex_prof_data[8].n_wait_times;
  (pcVar21->astats).mutex_prof_data[8].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[8].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[8].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[8].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[8].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[8].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[8].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[8].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[8].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[8].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[8].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[9].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[9].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[9].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[9].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[9].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[9].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[9].n_wait_times =
       (pcVar21->astats).mutex_prof_data[9].n_wait_times +
       (pcVar11->astats).mutex_prof_data[9].n_wait_times;
  (pcVar21->astats).mutex_prof_data[9].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[9].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[9].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[9].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[9].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[9].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[9].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[9].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[9].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[9].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[9].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[10].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[10].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[10].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[10].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[10].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[10].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[10].n_wait_times =
       (pcVar21->astats).mutex_prof_data[10].n_wait_times +
       (pcVar11->astats).mutex_prof_data[10].n_wait_times;
  (pcVar21->astats).mutex_prof_data[10].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[10].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[10].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[10].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[10].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[10].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[10].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[10].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[10].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[10].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[10].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar21->astats).mutex_prof_data[0xb].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[0xb].tot_wait_time);
  pnVar23 = &(pcVar21->astats).mutex_prof_data[0xb].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[0xb].max_wait_time;
  iVar16 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar16 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar19 = (pcVar11->astats).mutex_prof_data[0xb].n_spin_acquired;
  uVar25 = (pcVar21->astats).mutex_prof_data[0xb].n_spin_acquired;
  (pcVar21->astats).mutex_prof_data[0xb].n_wait_times =
       (pcVar21->astats).mutex_prof_data[0xb].n_wait_times +
       (pcVar11->astats).mutex_prof_data[0xb].n_wait_times;
  (pcVar21->astats).mutex_prof_data[0xb].n_spin_acquired = uVar25 + uVar19;
  uVar10 = (pcVar11->astats).mutex_prof_data[0xb].max_n_thds;
  if ((pcVar21->astats).mutex_prof_data[0xb].max_n_thds < uVar10) {
    (pcVar21->astats).mutex_prof_data[0xb].max_n_thds = uVar10;
  }
  (pcVar21->astats).mutex_prof_data[0xb].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[0xb].n_waiting_thds.repr +
       (pcVar21->astats).mutex_prof_data[0xb].n_waiting_thds.repr;
  puVar5 = &(pcVar21->astats).mutex_prof_data[0xb].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0xb].n_owner_switches;
  puVar5 = &(pcVar21->astats).mutex_prof_data[0xb].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0xb].n_lock_ops;
  if (!destroyed) {
    sVar18 = (pcVar11->astats).metadata_edata;
    (pcVar21->astats).base = (pcVar21->astats).base + (pcVar11->astats).base;
    (pcVar21->astats).metadata_edata = (pcVar21->astats).metadata_edata + sVar18;
    sVar18 = (pcVar11->astats).resident;
    (pcVar21->astats).metadata_rtree =
         (pcVar11->astats).metadata_rtree + (pcVar21->astats).metadata_rtree;
    (pcVar21->astats).resident = sVar18 + (pcVar21->astats).resident;
    psVar22 = &(pcVar21->astats).metadata_thp;
    *psVar22 = *psVar22 + (pcVar11->astats).metadata_thp;
    (pcVar21->astats).internal.repr =
         (pcVar11->astats).internal.repr + (pcVar21->astats).internal.repr;
    pcVar21->allocated_small = pcVar21->allocated_small + pcVar11->allocated_small;
  }
  uVar19 = pcVar11->ndalloc_small;
  pcVar21->nmalloc_small = pcVar21->nmalloc_small + pcVar11->nmalloc_small;
  pcVar21->ndalloc_small = pcVar21->ndalloc_small + uVar19;
  uVar19 = pcVar11->nfills_small;
  pcVar21->nrequests_small = pcVar11->nrequests_small + pcVar21->nrequests_small;
  pcVar21->nfills_small = uVar19 + pcVar21->nfills_small;
  pcVar21->nflushes_small = pcVar21->nflushes_small + pcVar11->nflushes_small;
  if (!destroyed) {
    psVar22 = &(pcVar21->astats).allocated_large;
    *psVar22 = *psVar22 + (pcVar11->astats).allocated_large;
  }
  uVar19 = (pcVar11->astats).ndalloc_large;
  (pcVar21->astats).nmalloc_large =
       (pcVar21->astats).nmalloc_large + (pcVar11->astats).nmalloc_large;
  (pcVar21->astats).ndalloc_large = (pcVar21->astats).ndalloc_large + uVar19;
  uVar19 = (pcVar11->astats).nrequests_large;
  (pcVar21->astats).nflushes_large =
       (pcVar11->astats).nflushes_large + (pcVar21->astats).nflushes_large;
  (pcVar21->astats).nrequests_large = uVar19 + (pcVar21->astats).nrequests_large;
  (pcVar21->astats).pa_shard_stats.pac_stats.abandoned_vm.repr =
       (pcVar11->astats).pa_shard_stats.pac_stats.abandoned_vm.repr +
       (pcVar21->astats).pa_shard_stats.pac_stats.abandoned_vm.repr;
  sVar18 = (pcVar11->astats).tcache_stashed_bytes;
  (pcVar21->astats).tcache_bytes = (pcVar21->astats).tcache_bytes + (pcVar11->astats).tcache_bytes;
  (pcVar21->astats).tcache_stashed_bytes = (pcVar21->astats).tcache_stashed_bytes + sVar18;
  if (pcVar17->arena_ind == 0) {
    (pcVar21->astats).uptime.ns = (pcVar11->astats).uptime.ns;
  }
  lVar20 = 0;
  do {
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nmalloc + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.nmalloc + lVar20);
    lVar13 = plVar8[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.nmalloc + lVar20);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar13 + lVar12;
    plVar6 = (long *)((long)&pcVar21->bstats[0].stats_data.nrequests + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].stats_data.nrequests + lVar20);
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar21->bstats[0].stats_data.curregs + lVar20);
      *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].stats_data.curregs + lVar20);
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nfills + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.nfills + lVar20);
    lVar13 = plVar8[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.nslabs + lVar20);
    lVar14 = *plVar9;
    lVar15 = plVar9[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.nfills + lVar20);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar13 + lVar12;
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nslabs + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.nslabs + lVar20);
    *plVar8 = *plVar6 + lVar14;
    plVar8[1] = lVar12 + lVar15;
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.curslabs + lVar20);
      lVar12 = plVar6[1];
      plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.curslabs + lVar20);
      lVar13 = plVar8[1];
      plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.curslabs + lVar20);
      *plVar9 = *plVar8 + *plVar6;
      plVar9[1] = lVar13 + lVar12;
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.batch_pops + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.batch_pops + lVar20);
    lVar13 = plVar8[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.batch_pushes + lVar20);
    lVar14 = *plVar9;
    lVar15 = plVar9[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].stats_data.batch_pops + lVar20);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar13 + lVar12;
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.batch_pushes + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].stats_data.batch_pushes + lVar20);
    *plVar8 = *plVar6 + lVar14;
    plVar8[1] = lVar12 + lVar15;
    duckdb_je_nstime_add
              ((nstime_t *)((long)&pcVar21->bstats[0].mutex_data.tot_wait_time.ns + lVar20),
               (nstime_t *)((long)&pcVar11->bstats[0].mutex_data.tot_wait_time.ns + lVar20));
    pnVar24 = (nstime_t *)((long)&pcVar21->bstats[0].mutex_data.max_wait_time.ns + lVar20);
    pnVar23 = (nstime_t *)((long)&pcVar11->bstats[0].mutex_data.max_wait_time.ns + lVar20);
    iVar16 = duckdb_je_nstime_compare(pnVar24,pnVar23);
    if (iVar16 < 0) {
      duckdb_je_nstime_copy(pnVar24,pnVar23);
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].mutex_data.n_wait_times + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->bstats[0].mutex_data.n_wait_times + lVar20);
    lVar13 = plVar8[1];
    plVar9 = (long *)((long)&pcVar21->bstats[0].mutex_data.n_wait_times + lVar20);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar13 + lVar12;
    uVar10 = *(uint *)((long)&pcVar11->bstats[0].mutex_data.max_n_thds + lVar20);
    if (*(uint *)((long)&pcVar21->bstats[0].mutex_data.max_n_thds + lVar20) < uVar10) {
      *(uint *)((long)&pcVar21->bstats[0].mutex_data.max_n_thds + lVar20) = uVar10;
    }
    *(int *)((long)&pcVar21->bstats[0].mutex_data.n_waiting_thds.repr + lVar20) =
         *(int *)((long)&pcVar11->bstats[0].mutex_data.n_waiting_thds.repr + lVar20) +
         *(int *)((long)&pcVar21->bstats[0].mutex_data.n_waiting_thds.repr + lVar20);
    plVar6 = (long *)((long)&pcVar21->bstats[0].mutex_data.n_owner_switches + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].mutex_data.n_owner_switches + lVar20);
    plVar6 = (long *)((long)&pcVar21->bstats[0].mutex_data.n_lock_ops + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].mutex_data.n_lock_ops + lVar20);
    lVar20 = lVar20 + 0xb0;
  } while (lVar20 != 0x18c0);
  lVar20 = 0;
  do {
    plVar6 = (long *)((long)&pcVar21->lstats[0].nmalloc.val.repr + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].nmalloc.val.repr + lVar20);
    plVar6 = (long *)((long)&pcVar21->lstats[0].ndalloc.val.repr + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].ndalloc.val.repr + lVar20);
    plVar6 = (long *)((long)&pcVar21->lstats[0].nrequests.val.repr + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].nrequests.val.repr + lVar20);
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar21->lstats[0].curlextents + lVar20);
      *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].curlextents + lVar20);
    }
    lVar20 = lVar20 + 0x30;
  } while (lVar20 != 0x24c0);
  lVar20 = 0;
  do {
    plVar6 = (long *)((long)&pcVar21->estats[0].nmuzzy + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].nmuzzy + lVar20);
    plVar6 = (long *)((long)&pcVar21->estats[0].nretained + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].nretained + lVar20);
    plVar6 = (long *)((long)&pcVar11->estats[0].ndirty + lVar20);
    lVar12 = plVar6[1];
    plVar8 = (long *)((long)&pcVar21->estats[0].ndirty + lVar20);
    lVar13 = plVar8[1];
    plVar9 = (long *)((long)&pcVar21->estats[0].ndirty + lVar20);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar13 + lVar12;
    plVar6 = (long *)((long)&pcVar21->estats[0].muzzy_bytes + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].muzzy_bytes + lVar20);
    plVar6 = (long *)((long)&pcVar21->estats[0].retained_bytes + lVar20);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].retained_bytes + lVar20);
    lVar20 = lVar20 + 0x30;
  } while (lVar20 != 0x2550);
  duckdb_je_hpa_shard_stats_accum(&pcVar21->hpastats,&pcVar11->hpastats);
  (pcVar21->secstats).bytes = (pcVar21->secstats).bytes + (pcVar11->secstats).bytes;
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}